

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O2

LineInterpolationRange __thiscall
tcu::anon_unknown_3::calcLineInterpolationWeights
          (anon_unknown_3 *this,Vec2 *pa,float wa,Vec2 *pb,float wb,Vec2 *pr)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float minDivisor;
  float fVar6;
  float extraout_XMM0_Db;
  Vec2 VVar7;
  LineInterpolationRange LVar8;
  Vector<float,_2> local_40;
  Vector<float,_2> local_38;
  
  tcu::operator-(pr,pa);
  tcu::operator-(pb,pa);
  fVar1 = dot<float,2>(&local_40,&local_38);
  fVar2 = getMaxValueWithinError(fVar1,1);
  fVar1 = getMinValueWithinError(fVar1,1);
  tcu::operator-(pb,pa);
  fVar3 = lengthSquared<float,2>(&local_40);
  fVar4 = getMaxValueWithinError(fVar3,1);
  fVar3 = getMinValueWithinError(fVar3,1);
  fVar5 = maximalRangeDivision(fVar1,fVar2,fVar3,fVar4);
  fVar5 = getMaxValueWithinError(fVar5,3);
  fVar1 = minimalRangeDivision(fVar1,fVar2,fVar3,fVar4);
  fVar1 = getMinValueWithinError(fVar1,3);
  fVar2 = maximalRangeDivision(fVar1,fVar5,wb,wb);
  fVar2 = getMaxValueWithinError(fVar2,3);
  fVar3 = minimalRangeDivision(fVar1,fVar5,wb,wb);
  fVar3 = getMinValueWithinError(fVar3,3);
  fVar4 = maximalRangeDivision(1.0 - fVar5,1.0 - fVar1,wa,wa);
  fVar4 = getMaxValueWithinError(fVar4,3);
  fVar1 = minimalRangeDivision(1.0 - fVar5,1.0 - fVar1,wa,wa);
  fVar1 = getMinValueWithinError(fVar1,3);
  fVar5 = getMaxValueWithinError(fVar2 + fVar4,1);
  minDivisor = getMinValueWithinError(fVar3 + fVar1,1);
  fVar6 = maximalRangeDivision(fVar1,fVar4,minDivisor,fVar5);
  fVar6 = getMaxValueWithinError(fVar6,3);
  *(float *)this = fVar6;
  fVar6 = maximalRangeDivision(fVar3,fVar2,minDivisor,fVar5);
  fVar6 = getMaxValueWithinError(fVar6,3);
  *(float *)(this + 4) = fVar6;
  fVar1 = minimalRangeDivision(fVar1,fVar4,minDivisor,fVar5);
  fVar1 = getMinValueWithinError(fVar1,3);
  *(float *)(this + 8) = fVar1;
  VVar7.m_data[1] = 0.0;
  VVar7.m_data[0] = fVar2;
  fVar1 = minimalRangeDivision(fVar3,fVar2,minDivisor,fVar5);
  LVar8.max.m_data[0] = getMinValueWithinError(fVar1,3);
  LVar8.max.m_data[1] = extraout_XMM0_Db;
  *(float *)(this + 0xc) = LVar8.max.m_data[0];
  LVar8.min.m_data[0] = VVar7.m_data[0];
  LVar8.min.m_data[1] = VVar7.m_data[1];
  return LVar8;
}

Assistant:

LineInterpolationRange calcLineInterpolationWeights (const tcu::Vec2& pa, float wa, const tcu::Vec2& pb, float wb, const tcu::Vec2& pr)
{
	const int roundError	= 1;
	const int divError		= 3;

	// calc weights:
	//			(1-t) / wa					t / wb
	//		-------------------	,	-------------------
	//		(1-t) / wa + t / wb		(1-t) / wa + t / wb

	// Allow 1 ULP
	const float		dividend	= tcu::dot(pr - pa, pb - pa);
	const float		dividendMax	= getMaxValueWithinError(dividend, 1);
	const float		dividendMin	= getMinValueWithinError(dividend, 1);
	DE_ASSERT(dividendMin <= dividendMax);

	// Assuming lengthSquared will not be implemented as sqrt(x)^2, allow 1 ULP
	const float		divisor		= tcu::lengthSquared(pb - pa);
	const float		divisorMax	= getMaxValueWithinError(divisor, 1);
	const float		divisorMin	= getMinValueWithinError(divisor, 1);
	DE_ASSERT(divisorMin <= divisorMax);

	// Allow 3 ULP precision for division
	const float		tMax		= getMaxValueWithinError(maximalRangeDivision(dividendMin, dividendMax, divisorMin, divisorMax), divError);
	const float		tMin		= getMinValueWithinError(minimalRangeDivision(dividendMin, dividendMax, divisorMin, divisorMax), divError);
	DE_ASSERT(tMin <= tMax);

	const float		perspectiveTMax			= getMaxValueWithinError(maximalRangeDivision(tMin, tMax, wb, wb), divError);
	const float		perspectiveTMin			= getMinValueWithinError(minimalRangeDivision(tMin, tMax, wb, wb), divError);
	DE_ASSERT(perspectiveTMin <= perspectiveTMax);

	const float		perspectiveInvTMax		= getMaxValueWithinError(maximalRangeDivision((1.0f - tMax), (1.0f - tMin), wa, wa), divError);
	const float		perspectiveInvTMin		= getMinValueWithinError(minimalRangeDivision((1.0f - tMax), (1.0f - tMin), wa, wa), divError);
	DE_ASSERT(perspectiveInvTMin <= perspectiveInvTMax);

	const float		perspectiveDivisorMax	= getMaxValueWithinError(perspectiveTMax + perspectiveInvTMax, roundError);
	const float		perspectiveDivisorMin	= getMinValueWithinError(perspectiveTMin + perspectiveInvTMin, roundError);
	DE_ASSERT(perspectiveDivisorMin <= perspectiveDivisorMax);

	LineInterpolationRange returnValue;
	returnValue.max.x() = getMaxValueWithinError(maximalRangeDivision(perspectiveInvTMin,	perspectiveInvTMax,	perspectiveDivisorMin, perspectiveDivisorMax), divError);
	returnValue.max.y() = getMaxValueWithinError(maximalRangeDivision(perspectiveTMin,		perspectiveTMax,	perspectiveDivisorMin, perspectiveDivisorMax), divError);
	returnValue.min.x() = getMinValueWithinError(minimalRangeDivision(perspectiveInvTMin,	perspectiveInvTMax,	perspectiveDivisorMin, perspectiveDivisorMax), divError);
	returnValue.min.y() = getMinValueWithinError(minimalRangeDivision(perspectiveTMin,		perspectiveTMax,	perspectiveDivisorMin, perspectiveDivisorMax), divError);

	DE_ASSERT(returnValue.min.x() <= returnValue.max.x());
	DE_ASSERT(returnValue.min.y() <= returnValue.max.y());

	return returnValue;
}